

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,Reader *params,char (*params_1) [4],
          StringTree *params_2)

{
  Reader *value;
  char (*value_00) [4];
  StringTree *pSVar1;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  NoInfer<kj::StringTree> *local_28;
  StringTree *params_local_2;
  char (*params_local_1) [4];
  Reader *params_local;
  
  local_28 = (NoInfer<kj::StringTree> *)params_1;
  params_local_2 = (StringTree *)params;
  params_local_1 = (char (*) [4])this;
  params_local = (Reader *)__return_storage_ptr__;
  value = fwd<capnp::Text::Reader>((NoInfer<capnp::Text::Reader> *)this);
  local_38 = _::toStringTreeOrCharSequence<capnp::Text::Reader>(value);
  value_00 = ::const((char (*) [4])params_local_2);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[4]>(value_00);
  pSVar1 = fwd<kj::StringTree>(local_28);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,(ArrayPtr<const_char> *)pSVar1
             ,params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}